

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::reparentFocusWidgets(QWidgetPrivate *this,QWidget *oldtlw)

{
  QWidget *pQVar1;
  
  pQVar1 = QWidget::window(*(QWidget **)&this->field_0x8);
  if (pQVar1 != oldtlw) {
    if (this->focus_child != (QWidget *)0x0) {
      QWidget::clearFocus(this->focus_child);
    }
    reparentFocusChildren(this,Next);
    return;
  }
  return;
}

Assistant:

void QWidgetPrivate::reparentFocusWidgets(QWidget * oldtlw)
{
    Q_Q(QWidget);
    if (oldtlw == q->window())
        return; // nothing to do

    if (focus_child)
        focus_child->clearFocus();

    reparentFocusChildren(QWidgetPrivate::FocusDirection::Next);
}